

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

Node * __thiscall Parser::var_declaration(Node *__return_storage_ptr__,Parser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  lexemtype lVar2;
  ostream *poVar3;
  nodekind kind;
  lexemtype type;
  Node assignNode;
  lexemtype local_94;
  string local_90;
  Node local_70;
  
  local_94 = (this->lexer).lexem.type;
  if ((int)local_94 < 0x17) {
    kind = INT_DECL;
    if (local_94 != INTKW) {
      if (local_94 != DOUBLEKW) {
LAB_0010772a:
        poVar3 = std::operator<<((ostream *)&std::cout,"Unknown type");
        std::endl<char,std::char_traits<char>>(poVar3);
        exit(0);
      }
      kind = DOUBLE_DECL;
    }
  }
  else if (local_94 == CHARKW) {
    kind = CHAR_DECL;
  }
  else {
    if (local_94 != FLOATKW) goto LAB_0010772a;
    kind = FLOAT_DECL;
  }
  paVar1 = &local_70.value.field_2;
  local_70._if = false;
  local_70._else = false;
  local_70.value._M_string_length = 0;
  local_70.value.field_2._M_local_buf[0] = '\0';
  local_70.subnodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_70.subnodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_70.subnodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_70.value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
  Node::Node(__return_storage_ptr__,kind,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  addDeclVar(this,&local_94,&local_70,__return_storage_ptr__);
  do {
    while (lVar2 = (this->lexer).lexem.type, lVar2 == COMMA) {
      addDeclVar(this,&local_94,&local_70,__return_storage_ptr__);
    }
  } while (lVar2 != SEMICOLON);
  std::vector<Node,_std::allocator<Node>_>::~vector(&local_70.subnodes);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.value._M_dataplus._M_p != paVar1) {
    operator_delete(local_70.value._M_dataplus._M_p,
                    CONCAT71(local_70.value.field_2._M_allocated_capacity._1_7_,
                             local_70.value.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Node Parser::var_declaration() {
    nodekind kind = EMPTY;
    lexemtype type = getLexemType();
    switch (type) {
        case INTKW:
            kind = INT_DECL;
            break;
        case DOUBLEKW:
            kind = DOUBLE_DECL;
            break;
        case FLOATKW:
            kind = FLOAT_DECL;
            break;
        case CHARKW:
            kind = CHAR_DECL;
            break;
        default:
            cout << "Unknown type" << endl;
            exit(0);
    }
    Node assignNode;
    Node declNode = Node(kind);
    addDeclVar(type, assignNode, declNode);
    while (getLexemType() != SEMICOLON) {
        if (getLexemType() == COMMA) {
            addDeclVar(type, assignNode, declNode);
        }
    }
    // todo calculate expression and add it variables map as value
    if (getLexemType() != SEMICOLON) {
        cout << "\";\" expected" << endl;
        exit(0);
    }
    return declNode;
}